

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * __thiscall
cmSystemTools::RelativePath_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,char *local,char *remote)

{
  char *pcVar1;
  bool bVar2;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *remote_local;
  char *local_local;
  
  local_20 = local;
  remote_local = (char *)this;
  local_local = (char *)__return_storage_ptr__;
  bVar2 = cmsys::SystemTools::FileIsFullPath((char *)this);
  if (!bVar2) {
    Error("RelativePath must be passed a full path to local: ",remote_local,(char *)0x0,(char *)0x0)
    ;
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath(local_20);
  if (!bVar2) {
    Error("RelativePath must be passed a full path to remote: ",local_20,(char *)0x0,(char *)0x0);
  }
  pcVar1 = remote_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,pcVar1,&local_79);
  cmsys::SystemTools::RelativePath(__return_storage_ptr__,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::RelativePath(const char* local, const char* remote)
{
  if(!cmSystemTools::FileIsFullPath(local))
    {
    cmSystemTools::Error("RelativePath must be passed a full path to local: ",
                         local);
    }
  if(!cmSystemTools::FileIsFullPath(remote))
    {
    cmSystemTools::Error
      ("RelativePath must be passed a full path to remote: ", remote);
    }
  return cmsys::SystemTools::RelativePath(local, remote);
}